

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O3

void test_int32(void)

{
  char cVar1;
  char extraout_AL;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined8 in_RAX;
  undefined8 uVar6;
  undefined8 uVar7;
  long extraout_RAX;
  ulong uVar8;
  ulong uVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 extraout_RAX_02;
  undefined8 extraout_RAX_03;
  bson_t *bson;
  char *__buf;
  char *__n;
  char *pcVar13;
  char *pcVar14;
  char *extraout_RAX_04;
  dirent *pdVar15;
  size_t sVar16;
  size_t sVar17;
  DIR *__dirp;
  FILE *__stream;
  long lVar18;
  char *pcVar19;
  uint extraout_EDX;
  char *__dest;
  int paths_index;
  ulong uVar20;
  char *pcVar21;
  DIR *__s;
  DIR *__name;
  char *pcVar22;
  DIR *paths;
  DIR *__filename;
  undefined1 *unaff_R13;
  char *pcVar23;
  char *pcVar24;
  char *__n_00;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  int32_t i32;
  undefined1 auStack_7308 [8];
  undefined1 auStack_7300 [504];
  ulong uStack_7108;
  DIR *pDStack_7100;
  dirent *pdStack_70f8;
  DIR *pDStack_70f0;
  DIR *pDStack_70e8;
  stat sStack_70e0;
  char acStack_7050 [512];
  size_t sStack_6e50;
  dirent *pdStack_6e48;
  DIR *pDStack_6e40;
  char *pcStack_6e38;
  code *pcStack_6e30;
  char *pcStack_6e28;
  ulong uStack_6e20;
  char *pcStack_6e18;
  DIR *pDStack_6e10;
  code *pcStack_6e08;
  undefined8 uStack_6dd0;
  undefined1 *puStack_6dc8;
  undefined1 *puStack_6dc0;
  undefined1 auStack_6db0 [8];
  char *pcStack_6da8;
  char *pcStack_6d98;
  char *pcStack_6d90;
  undefined8 uStack_6d88;
  undefined8 uStack_6d70;
  DIR aDStack_6d00 [25944];
  char *pcStack_7a8;
  char *pcStack_7a0;
  char *pcStack_798;
  char *pcStack_790;
  code *apcStack_788 [2];
  undefined1 auStack_778 [116];
  uint uStack_704;
  char acStack_700 [256];
  undefined8 uStack_600;
  char *pcStack_5f8;
  char *pcStack_5f0;
  char *pcStack_5e8;
  char *pcStack_5e0;
  char *pcStack_5d8;
  char *pcStack_5d0;
  undefined8 uStack_5c8;
  code *pcStack_5c0;
  char *pcStack_5b8;
  undefined8 uStack_5b0;
  char *pcStack_5a8;
  char *pcStack_5a0;
  char *pcStack_598;
  char *pcStack_590;
  code *pcStack_588;
  undefined8 uStack_580;
  undefined8 uStack_578;
  char *pcStack_570;
  char *pcStack_568;
  char *pcStack_560;
  undefined8 uStack_558;
  bson_t *pbStack_550;
  char *pcStack_548;
  code *pcStack_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  char *pcStack_520;
  char *pcStack_518;
  char *pcStack_510;
  char *pcStack_508;
  char *pcStack_500;
  code *pcStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4e0;
  undefined1 *puStack_4d8;
  char *pcStack_4d0;
  char *pcStack_4c8;
  code *pcStack_4c0;
  undefined8 uStack_4b8;
  ulong uStack_4b0;
  ulong uStack_4a8;
  undefined1 *puStack_4a0;
  char *pcStack_498;
  void *pvStack_490;
  code *pcStack_488;
  uint uStack_404;
  undefined1 auStack_400 [4];
  uint uStack_3fc;
  ulong uStack_2b0;
  ulong uStack_2a8;
  undefined1 *puStack_2a0;
  char *pcStack_298;
  void *pvStack_290;
  code *apcStack_288 [16];
  uint uStack_204;
  undefined1 auStack_200 [4];
  uint uStack_1fc;
  undefined8 uStack_b8;
  long lStack_58;
  undefined8 uStack_50;
  code *pcStack_48;
  undefined8 uStack_40;
  int iStack_38;
  int iStack_34;
  undefined8 uStack_30;
  char *pcStack_28;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  uVar6 = bson_bcon_magic();
  uVar6 = bcon_new(0,"foo",uVar6,0xf,10,0);
  uVar7 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0xf,&local_14,0);
  if (cVar1 == '\0') {
    test_int32_cold_1();
  }
  else if (local_14 == 10) {
    bson_destroy(uVar6);
    return;
  }
  test_int32_cold_2();
  pcStack_28 = "foo";
  pcStack_48 = (code *)0x13d07b;
  uStack_30 = uVar6;
  uVar6 = bson_bcon_magic();
  pvVar10 = (void *)0x0;
  uStack_40 = 0;
  pcStack_48 = (code *)0x13d0a9;
  uVar6 = bcon_new(0,"foo",uVar6,0x10,100,1000);
  pcStack_48 = (code *)0x13d0b1;
  uVar7 = bson_bcone_magic();
  uStack_40 = 0;
  pcStack_48 = (code *)0x13d0d4;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x10,&iStack_34,&iStack_38);
  if (cVar1 == '\0') {
    pcStack_48 = (code *)0x13d100;
    test_timestamp_cold_1();
LAB_0013d100:
    pcStack_48 = (code *)0x13d105;
    test_timestamp_cold_2();
  }
  else {
    if (iStack_34 != 100) goto LAB_0013d100;
    if (iStack_38 == 1000) {
      pcStack_48 = (code *)0x13d0f1;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_48 = test_int64;
  test_timestamp_cold_3();
  pcStack_48 = (code *)0x1403a7;
  lStack_58 = extraout_RAX;
  uStack_50 = uVar6;
  uVar6 = bson_bcon_magic();
  uVar6 = bcon_new(0,"foo",uVar6,0x11,10,0);
  uVar7 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x11,&lStack_58,0);
  if (cVar1 == '\0') {
    test_int64_cold_1();
  }
  else if (lStack_58 == 10) {
    bson_destroy(uVar6);
    return;
  }
  test_int64_cold_2();
  uVar6 = bson_bcon_magic();
  uVar6 = bcon_new(0,"foo",uVar6,0x13,0);
  uVar7 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x13,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  test_maxkey_cold_1();
  uVar6 = bson_bcon_magic();
  uVar6 = bcon_new(0,"foo",uVar6,0x14,0);
  uVar7 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x14,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  test_minkey_cold_1();
  apcStack_288[0] = (code *)0x13d26e;
  uStack_b8 = uVar6;
  uVar8 = bcon_new(0,"bar","baz",0);
  apcStack_288[0] = (code *)0x13d276;
  uVar6 = bson_bcon_magic();
  pcVar24 = "foo";
  apcStack_288[0] = (code *)0x13d297;
  uVar9 = bcon_new(0,"foo",uVar6,2,uVar8,0);
  apcStack_288[0] = (code *)0x13d29f;
  uVar6 = bson_bcone_magic();
  apcStack_288[0] = (code *)0x13d2bf;
  cVar1 = bcon_extract(uVar9,"foo",uVar6,2,auStack_200,0);
  if (cVar1 == '\0') {
    apcStack_288[0] = (code *)0x13d43f;
    test_bson_document_cold_1();
  }
  else {
    apcStack_288[0] = (code *)0x13d2d7;
    pvVar10 = (void *)bson_get_data(auStack_200);
    apcStack_288[0] = (code *)0x13d2e2;
    pcVar24 = (char *)bson_get_data(uVar8);
    if (*(uint *)(uVar8 + 4) == uStack_1fc) {
      apcStack_288[0] = (code *)0x13d2f6;
      pvVar11 = (void *)bson_get_data(uVar8);
      apcStack_288[0] = (code *)0x13d306;
      pvVar12 = (void *)bson_get_data(auStack_200);
      apcStack_288[0] = (code *)0x13d314;
      iVar2 = bcmp(pvVar11,pvVar12,(ulong)*(uint *)(uVar8 + 4));
      if (iVar2 == 0) {
        apcStack_288[0] = (code *)0x13d325;
        bson_destroy(auStack_200);
        apcStack_288[0] = (code *)0x13d32d;
        bson_destroy(uVar8);
        apcStack_288[0] = (code *)0x13d335;
        bson_destroy(uVar9);
        return;
      }
    }
    unaff_R13 = auStack_200;
    apcStack_288[0] = (code *)0x13d356;
    uVar9 = bson_as_canonical_extended_json(unaff_R13);
    apcStack_288[0] = (code *)0x13d363;
    uVar6 = bson_as_canonical_extended_json(uVar8);
    uVar3 = *(uint *)(uVar8 + 4);
    if (uStack_1fc != 0) {
      uVar20 = 0;
      do {
        if (uVar3 == (uint)uVar20) break;
        if (*(char *)((long)pvVar10 + uVar20) != pcVar24[uVar20]) goto LAB_0013d433;
        uVar20 = uVar20 + 1;
      } while (uStack_1fc != (uint)uVar20);
    }
    uVar4 = uStack_1fc;
    if (uStack_1fc < uVar3) {
      uVar4 = uVar3;
    }
    uVar20 = (ulong)(uVar4 - 1);
    while( true ) {
      apcStack_288[0] = (code *)0x13d3af;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,uVar9,uVar6);
      apcStack_288[0] = (code *)0x13d3c7;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      uVar9 = (ulong)uVar3;
      apcStack_288[0] = (code *)0x13d3e2;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_204 = uVar3;
      if (uVar3 == 0xffffffff) break;
      unaff_R13 = (undefined1 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_0013d444;
      uVar9 = (ulong)uStack_1fc;
      apcStack_288[0] = (code *)0x13d40c;
      uVar20 = write(uVar3,pvVar10,uVar9);
      if (uVar20 != uVar9) goto LAB_0013d449;
      uVar8 = (ulong)*(uint *)(uVar8 + 4);
      apcStack_288[0] = (code *)0x13d422;
      uVar20 = write(uVar4,pcVar24,uVar8);
      if (uVar20 != uVar8) goto LAB_0013d44e;
      uVar20 = (ulong)uVar4;
      apcStack_288[0] = (code *)0x13d433;
      test_bson_document_cold_4();
      uVar6 = extraout_RAX_00;
LAB_0013d433:
      uVar20 = uVar20 & 0xffffffff;
    }
  }
  apcStack_288[0] = (code *)0x13d444;
  test_bson_document_cold_6();
LAB_0013d444:
  apcStack_288[0] = (code *)0x13d449;
  test_bson_document_cold_5();
LAB_0013d449:
  apcStack_288[0] = (code *)0x13d44e;
  test_bson_document_cold_2();
LAB_0013d44e:
  apcStack_288[0] = test_bson_array;
  test_bson_document_cold_3();
  pcStack_488 = (code *)0x13d484;
  uStack_2b0 = uVar8;
  uStack_2a8 = uVar9;
  puStack_2a0 = unaff_R13;
  pcStack_298 = pcVar24;
  pvStack_290 = pvVar10;
  apcStack_288[0] = (code *)&stack0xffffffffffffff70;
  uVar8 = bcon_new(0,"0","baz",0);
  pcStack_488 = (code *)0x13d48c;
  uVar6 = bson_bcon_magic();
  pcVar24 = "foo";
  pcStack_488 = (code *)0x13d4ad;
  uVar9 = bcon_new(0,"foo",uVar6,3,uVar8,0);
  pcStack_488 = (code *)0x13d4b5;
  uVar6 = bson_bcone_magic();
  pcStack_488 = (code *)0x13d4d5;
  cVar1 = bcon_extract(uVar9,"foo",uVar6,3,auStack_400,0);
  if (cVar1 == '\0') {
    pcStack_488 = (code *)0x13d655;
    test_bson_array_cold_1();
  }
  else {
    pcStack_488 = (code *)0x13d4ed;
    pvVar10 = (void *)bson_get_data(auStack_400);
    pcStack_488 = (code *)0x13d4f8;
    pcVar24 = (char *)bson_get_data(uVar8);
    if (*(uint *)(uVar8 + 4) == uStack_3fc) {
      pcStack_488 = (code *)0x13d50c;
      pvVar11 = (void *)bson_get_data(uVar8);
      pcStack_488 = (code *)0x13d51c;
      pvVar12 = (void *)bson_get_data(auStack_400);
      pcStack_488 = (code *)0x13d52a;
      iVar2 = bcmp(pvVar11,pvVar12,(ulong)*(uint *)(uVar8 + 4));
      if (iVar2 == 0) {
        pcStack_488 = (code *)0x13d53b;
        bson_destroy(auStack_400);
        pcStack_488 = (code *)0x13d543;
        bson_destroy(uVar8);
        pcStack_488 = (code *)0x13d54b;
        bson_destroy(uVar9);
        return;
      }
    }
    unaff_R13 = auStack_400;
    pcStack_488 = (code *)0x13d56c;
    uVar9 = bson_as_canonical_extended_json(unaff_R13);
    pcStack_488 = (code *)0x13d579;
    uVar6 = bson_as_canonical_extended_json(uVar8);
    uVar3 = *(uint *)(uVar8 + 4);
    if (uStack_3fc != 0) {
      uVar20 = 0;
      do {
        if (uVar3 == (uint)uVar20) break;
        if (*(char *)((long)pvVar10 + uVar20) != pcVar24[uVar20]) goto LAB_0013d649;
        uVar20 = uVar20 + 1;
      } while (uStack_3fc != (uint)uVar20);
    }
    uVar4 = uStack_3fc;
    if (uStack_3fc < uVar3) {
      uVar4 = uVar3;
    }
    uVar20 = (ulong)(uVar4 - 1);
    while( true ) {
      pcStack_488 = (code *)0x13d5c5;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,uVar9,uVar6);
      pcStack_488 = (code *)0x13d5dd;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      uVar9 = (ulong)uVar3;
      pcStack_488 = (code *)0x13d5f8;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_404 = uVar3;
      if (uVar3 == 0xffffffff) break;
      unaff_R13 = (undefined1 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_0013d65a;
      uVar9 = (ulong)uStack_3fc;
      pcStack_488 = (code *)0x13d622;
      uVar20 = write(uVar3,pvVar10,uVar9);
      if (uVar20 != uVar9) goto LAB_0013d65f;
      uVar8 = (ulong)*(uint *)(uVar8 + 4);
      pcStack_488 = (code *)0x13d638;
      uVar20 = write(uVar4,pcVar24,uVar8);
      if (uVar20 != uVar8) goto LAB_0013d664;
      uVar20 = (ulong)uVar4;
      pcStack_488 = (code *)0x13d649;
      test_bson_array_cold_4();
      uVar6 = extraout_RAX_01;
LAB_0013d649:
      uVar20 = uVar20 & 0xffffffff;
    }
  }
  pcStack_488 = (code *)0x13d65a;
  test_bson_array_cold_6();
LAB_0013d65a:
  pcStack_488 = (code *)0x13d65f;
  test_bson_array_cold_5();
LAB_0013d65f:
  pcStack_488 = (code *)0x13d664;
  test_bson_array_cold_2();
LAB_0013d664:
  pcStack_488 = test_inline_array;
  test_bson_array_cold_3();
  pcStack_4c0 = (code *)0x13d679;
  uStack_4b8 = extraout_RAX_02;
  uStack_4b0 = uVar8;
  uStack_4a8 = uVar9;
  puStack_4a0 = unaff_R13;
  pcStack_498 = pcVar24;
  pvStack_490 = pvVar10;
  pcStack_488 = (code *)apcStack_288;
  uStack_4e8 = bson_bcon_magic();
  pcStack_4c8 = (char *)0x0;
  pcStack_4d0 = "]";
  puStack_4d8 = (undefined1 *)0x2;
  uStack_4e0 = 0xf;
  uStack_4f0 = 0x13d6c1;
  uVar6 = bcon_new(0,"foo","[",uStack_4e8,0xf,1);
  pcStack_4c0 = (code *)0x13d6cd;
  uStack_4e8 = bson_bcone_magic();
  pcStack_4c8 = (char *)0x0;
  pcStack_4d0 = "]";
  uStack_4e0 = 0xf;
  uStack_4f0 = 0x13d6fc;
  puStack_4d8 = (undefined1 *)&uStack_4b8;
  cVar1 = bcon_extract(uVar6,"foo","[",uStack_4e8,0xf,(long)&uStack_4b8 + 4);
  if (cVar1 == '\0') {
    pcStack_4c0 = (code *)0x13d72d;
    test_inline_array_cold_1();
LAB_0013d72d:
    pcStack_4c0 = (code *)0x13d732;
    test_inline_array_cold_2();
  }
  else {
    if (uStack_4b8._4_4_ != 1) goto LAB_0013d72d;
    if ((int)uStack_4b8 == 2) {
      pcStack_4c0 = (code *)0x13d719;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_4c0 = test_inline_doc;
  test_inline_array_cold_3();
  pcStack_4c0 = (code *)0x14a05b;
  pcStack_4c8 = "[";
  pcStack_4d0 = "foo";
  puStack_4d8 = (undefined1 *)0x0;
  uStack_4e0 = 0xf;
  pcStack_4f8 = (code *)0x13d747;
  uStack_4f0 = extraout_RAX_03;
  uStack_4e8 = uVar6;
  pcStack_520 = (char *)bson_bcon_magic();
  pcStack_500 = (char *)0x0;
  pcStack_508 = "}";
  pcStack_510 = (char *)0x1;
  pcStack_518 = (char *)0xf;
  uStack_528 = "a";
  uStack_530 = 2;
  uStack_538 = 0x13d79a;
  uVar6 = bcon_new(0,"foo","{","b",pcStack_520,0xf);
  pcStack_4f8 = (code *)0x13d7a6;
  pcStack_520 = (char *)bson_bcone_magic();
  uStack_530 = (long)&uStack_4f0 + 4;
  pcStack_500 = (char *)0x0;
  pcStack_508 = "}";
  pcStack_518 = (char *)0xf;
  uStack_528 = "b";
  uStack_538 = 0x13d7e9;
  pcStack_510 = (char *)&uStack_4f0;
  cVar1 = bcon_extract(uVar6,"foo","{","a",pcStack_520,0xf);
  if (cVar1 == '\0') {
    pcStack_4f8 = (code *)0x13d81a;
    test_inline_doc_cold_1();
LAB_0013d81a:
    pcStack_4f8 = (code *)0x13d81f;
    test_inline_doc_cold_2();
  }
  else {
    if (uStack_4f0._4_4_ != 1) goto LAB_0013d81a;
    if ((int)uStack_4f0 == 2) {
      pcStack_4f8 = (code *)0x13d806;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_4f8 = test_extract_ctx;
  test_inline_doc_cold_3();
  pcStack_4f8 = (code *)0x0;
  pcStack_500 = "a";
  pcStack_510 = "{";
  pcStack_518 = "foo";
  pcStack_520 = "}";
  pcStack_540 = (code *)0x13d837;
  pcStack_508 = (char *)uVar6;
  uStack_578 = (undefined8 *)bson_bcon_magic();
  pcStack_540 = (code *)0x0;
  pcStack_548 = (char *)0x3;
  pbStack_550 = (bson_t *)0xf;
  pcStack_560 = "c";
  pcStack_568 = (char *)0x2;
  pcStack_570 = (char *)0xf;
  uStack_580 = 0x13d879;
  uStack_558 = uStack_578;
  bson = (bson_t *)bcon_new(0,"a",uStack_578,0xf,1,"b");
  pcStack_540 = (code *)0x13d885;
  pcStack_588 = (code *)bson_bcone_magic();
  pbStack_550 = (bson_t *)((long)&uStack_530 + 4);
  uStack_578 = &uStack_528;
  pcStack_548 = (char *)0x0;
  uStack_558 = 0xf;
  pcStack_568 = "c";
  pcStack_570 = (char *)0x0;
  uStack_580 = 0xf;
  pcStack_590 = "b";
  pcStack_598 = (char *)0x0;
  pcStack_5a0 = (char *)0x13d8d1;
  pcStack_560 = (char *)pcStack_588;
  test_extract_ctx_helper(bson,3,"a",pcStack_588,0xf,(long)&uStack_528 + 4);
  if (uStack_528._4_4_ == 1) {
    if ((int)uStack_528 != 2) goto LAB_0013d906;
    if (uStack_530._4_4_ == 3) {
      pcStack_540 = (code *)0x13d8f2;
      bson_destroy(bson);
      return;
    }
  }
  else {
    pcStack_540 = (code *)0x13d906;
    test_extract_ctx_cold_1();
LAB_0013d906:
    pcStack_540 = (code *)0x13d90b;
    test_extract_ctx_cold_2();
  }
  pcStack_540 = test_nested;
  test_extract_ctx_cold_3();
  pcStack_540 = (code *)0xf;
  pcStack_548 = "a";
  uStack_558 = 0;
  pcStack_568 = "c";
  pcStack_588 = (code *)0x13d923;
  pcStack_560 = (char *)((long)&uStack_528 + 4);
  pbStack_550 = bson;
  uStack_5b0 = bson_bcon_magic();
  pcStack_590 = (char *)0x0;
  pcStack_598 = "}";
  pcStack_5a0 = (char *)0xa;
  pcStack_5a8 = (char *)0xf;
  pcStack_5b8 = (char *)0x13d978;
  uVar6 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_588 = (code *)0x13d984;
  uStack_5b0 = bson_bcone_magic();
  pcStack_5a0 = (char *)((long)&uStack_578 + 4);
  pcStack_590 = (char *)0x0;
  pcStack_598 = "}";
  pcStack_5a8 = (char *)0xf;
  pcStack_5b8 = "bar";
  pcStack_5c0 = (code *)0x141970;
  uStack_5c8 = 0x13d9c0;
  cVar1 = bcon_extract(uVar6,"hello",uStack_5b0,0,&pcStack_570,"foo");
  if (cVar1 == '\0') {
    pcStack_588 = (code *)0x13da00;
    test_nested_cold_1();
LAB_0013da00:
    pcStack_588 = (code *)0x13da05;
    test_nested_cold_2();
  }
  else {
    pcStack_588 = (code *)0x13d9d9;
    iVar2 = strcmp("world",pcStack_570);
    if (iVar2 != 0) goto LAB_0013da00;
    if (uStack_578._4_4_ == 10) {
      pcStack_588 = (code *)0x13d9ec;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_588 = test_skip;
  test_nested_cold_3();
  pcStack_588 = (code *)0x14ad57;
  pcStack_590 = "bar";
  pcStack_598 = (char *)0x0;
  pcStack_5a0 = "hello";
  pcStack_5a8 = "foo";
  pcStack_5c0 = (code *)0x13da1a;
  uStack_5b0 = uVar6;
  pcStack_5e8 = (char *)bson_bcon_magic();
  uStack_5c8 = 0;
  pcStack_5d0 = "}";
  pcStack_5d8 = (char *)0xa;
  pcStack_5e0 = (char *)0xf;
  pcStack_5f0 = (char *)0x13da6d;
  uVar6 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_5c0 = (code *)0x13da79;
  pcVar24 = (char *)bson_bcone_magic();
  pcVar23 = "}";
  uStack_5c8 = 0;
  pcStack_5d0 = "}";
  pcStack_5d8 = (char *)0x10;
  pcStack_5e0 = (char *)0x1c;
  pcStack_5f0 = "bar";
  pcStack_5f8 = "{";
  uStack_600 = 0x13dab5;
  pcStack_5e8 = pcVar24;
  cVar1 = bcon_extract(uVar6,"hello",pcVar24,0x1c,2);
  if (cVar1 == '\0') {
    pcStack_5c0 = (code *)0x13db17;
    test_skip_cold_1();
  }
  else {
    uStack_5c8 = 0;
    pcStack_5d0 = "}";
    pcStack_5d8 = (char *)0x12;
    pcStack_5e0 = (char *)0x1c;
    pcStack_5f0 = "bar";
    pcStack_5f8 = "{";
    uStack_600 = 0x13daf4;
    pcStack_5e8 = pcVar24;
    cVar1 = bcon_extract(uVar6,"hello",pcVar24,0x1c,2);
    if (cVar1 == '\0') {
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_5c0 = test_iter;
  test_skip_cold_2();
  pcStack_5c0 = (code *)0x14e902;
  pcStack_5d0 = "bar";
  pcStack_5d8 = "}";
  pcStack_5e8 = "{";
  apcStack_788[0] = (code *)0x13db39;
  pcStack_5e0 = pcVar24;
  uStack_5c8 = uVar6;
  __buf = (char *)bson_bcon_magic();
  __n_00 = "foo";
  apcStack_788[0] = (code *)0x13db60;
  __n = (char *)bcon_new(0,"foo",__buf,0xf,10);
  apcStack_788[0] = (code *)0x13db68;
  uVar6 = bson_bcone_magic();
  pcVar13 = acStack_700;
  pcVar21 = "foo";
  pcVar19 = (char *)0x1d;
  uVar7 = 0;
  apcStack_788[0] = (code *)0x13db88;
  pcVar22 = __n;
  cVar1 = bcon_extract(__n,"foo",uVar6);
  if (cVar1 == '\0') {
    apcStack_788[0] = (code *)0x13dd34;
    uVar6 = extraout_XMM1_Qa;
    test_iter_cold_1();
LAB_0013dd34:
    apcStack_788[0] = (code *)0x13dd39;
    test_iter_cold_2();
  }
  else {
    pcVar22 = acStack_700;
    apcStack_788[0] = (code *)0x13db9d;
    iVar2 = bson_iter_type();
    uVar6 = extraout_XMM1_Qa_00;
    if (iVar2 != 0x10) goto LAB_0013dd34;
    pcVar22 = acStack_700;
    apcStack_788[0] = (code *)0x13dbb3;
    iVar2 = bson_iter_int32();
    uVar6 = extraout_XMM1_Qa_01;
    if (iVar2 == 10) {
      uVar7 = 0;
      apcStack_788[0] = (code *)0x13dbdf;
      __n_00 = (char *)bcon_new(0,"foo",__buf,0x1d,acStack_700);
      apcStack_788[0] = (code *)0x13dbea;
      pcVar24 = (char *)bson_get_data(__n_00);
      apcStack_788[0] = (code *)0x13dbf5;
      __buf = (char *)bson_get_data(__n);
      if (*(int *)(__n + 4) == *(int *)(__n_00 + 4)) {
        apcStack_788[0] = (code *)0x13dc09;
        pvVar10 = (void *)bson_get_data(__n);
        apcStack_788[0] = (code *)0x13dc14;
        pvVar11 = (void *)bson_get_data(__n_00);
        apcStack_788[0] = (code *)0x13dc22;
        iVar2 = bcmp(pvVar10,pvVar11,(ulong)*(uint *)(__n + 4));
        if (iVar2 == 0) {
          apcStack_788[0] = (code *)0x13dc2e;
          bson_destroy(__n);
          apcStack_788[0] = (code *)0x13dc36;
          bson_destroy(__n_00);
          return;
        }
      }
      apcStack_788[0] = (code *)0x13dc4f;
      pcVar23 = (char *)bson_as_canonical_extended_json(__n_00);
      apcStack_788[0] = (code *)0x13dc5c;
      pcVar13 = (char *)bson_as_canonical_extended_json(__n);
      uVar3 = *(uint *)(__n_00 + 4);
      uVar4 = *(uint *)(__n + 4);
      uVar6 = extraout_XMM1_Qa_02;
      if (uVar3 != 0) {
        uVar8 = 0;
        do {
          if (uVar4 == (uint)uVar8) break;
          if (pcVar24[uVar8] != __buf[uVar8]) goto LAB_0013dd28;
          uVar8 = uVar8 + 1;
        } while (uVar3 != (uint)uVar8);
      }
      if (uVar3 < uVar4) {
        uVar3 = uVar4;
      }
      uVar8 = (ulong)(uVar3 - 1);
      pcVar19 = pcVar23;
      while( true ) {
        apcStack_788[0] = (code *)0x13dca8;
        fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar8);
        apcStack_788[0] = (code *)0x13dcc0;
        uVar3 = open("failure.bad.bson",0x42,0x1a0);
        pcVar23 = (char *)(ulong)uVar3;
        pcVar22 = "failure.expected.bson";
        pcVar21 = (char *)0x42;
        apcStack_788[0] = (code *)0x13dcdb;
        uVar4 = open("failure.expected.bson",0x42,0x1a0);
        uStack_704 = uVar3;
        if (uVar3 == 0xffffffff) break;
        if (uVar4 == 0xffffffff) goto LAB_0013dd43;
        pcVar23 = (char *)(ulong)uVar4;
        __n_00 = (char *)(ulong)*(uint *)(__n_00 + 4);
        pcVar22 = (char *)(ulong)uVar3;
        apcStack_788[0] = (code *)0x13dd01;
        pcVar21 = pcVar24;
        pcVar14 = (char *)write(uVar3,pcVar24,(size_t)__n_00);
        if (pcVar14 != __n_00) goto LAB_0013dd48;
        __n = (char *)(ulong)*(uint *)(__n + 4);
        apcStack_788[0] = (code *)0x13dd17;
        pcVar21 = __buf;
        pcVar22 = pcVar23;
        pcVar14 = (char *)write(uVar4,__buf,(size_t)__n);
        if (pcVar14 != __n) goto LAB_0013dd4d;
        uVar8 = (ulong)uVar4;
        apcStack_788[0] = (code *)0x13dd28;
        test_iter_cold_6();
        pcVar13 = extraout_RAX_04;
LAB_0013dd28:
        uVar8 = uVar8 & 0xffffffff;
        pcVar19 = pcVar23;
      }
      goto LAB_0013dd3e;
    }
  }
  apcStack_788[0] = (code *)0x13dd3e;
  test_iter_cold_3();
LAB_0013dd3e:
  apcStack_788[0] = (code *)0x13dd43;
  test_iter_cold_8();
LAB_0013dd43:
  apcStack_788[0] = (code *)0x13dd48;
  test_iter_cold_7();
LAB_0013dd48:
  apcStack_788[0] = (code *)0x13dd4d;
  test_iter_cold_4();
LAB_0013dd4d:
  apcStack_788[0] = test_extract_ctx_helper;
  test_iter_cold_5();
  puStack_6dc0 = auStack_6db0;
  if (extraout_AL != '\0') {
    uStack_6d70 = uVar6;
  }
  pcStack_6e08 = (code *)0x13ddd5;
  pcStack_6da8 = pcVar21;
  pcStack_6d98 = pcVar19;
  pcStack_6d90 = pcVar13;
  uStack_6d88 = uVar7;
  pcStack_7a8 = __n;
  pcStack_7a0 = pcVar24;
  pcStack_798 = __buf;
  pcStack_790 = __n_00;
  apcStack_788[0] = (code *)&pcStack_5c0;
  bcon_extract_ctx_init(aDStack_6d00);
  puStack_6dc8 = auStack_778;
  uStack_6dd0 = 0x3000000010;
  uVar6 = 0x10;
  if (0 < (int)(uint)pcStack_6da8) {
    uVar3 = (uint)pcStack_6da8;
    do {
      pcStack_6e08 = (code *)0x13de41;
      __s = aDStack_6d00;
      pcVar24 = pcVar22;
      cVar1 = bcon_extract_ctx_va(pcVar22,aDStack_6d00,&uStack_6dd0);
      iVar2 = (int)uVar6;
      if (cVar1 == '\0') {
        pcStack_6e08 = assemble_path;
        test_extract_ctx_helper_cold_1();
        pcStack_6e30 = (code *)0x13de73;
        __name = __s;
        pcStack_6e28 = pcVar22;
        uStack_6e20 = (ulong)uVar3;
        pcStack_6e18 = pcVar23;
        pDStack_6e10 = aDStack_6d00;
        pcStack_6e08 = (code *)&uStack_6dd0;
        pdVar15 = (dirent *)strlen(pcVar24);
        pcStack_6e30 = (code *)0x13de7e;
        paths = __s;
        sVar16 = strlen((char *)__s);
        if ((int)sVar16 + (int)pdVar15 < 499) {
          pcStack_6e30 = (code *)0x13de9a;
          memset(__dest,0,500);
          pcStack_6e30 = (code *)0x13dea8;
          strncat(__dest,pcVar24,(long)(int)pdVar15);
          pcStack_6e30 = (code *)0x13deb0;
          sVar17 = strlen(__dest);
          (__dest + sVar17)[0] = '/';
          (__dest + sVar17)[1] = '\0';
          pcStack_6e30 = (code *)0x13dec4;
          strncat(__dest,(char *)__s,(long)(int)sVar16);
          pcVar24 = __dest;
          do {
            if (*pcVar24 == '\\') {
              *pcVar24 = '/';
            }
            else if (*pcVar24 == '\0') {
              return;
            }
            pcVar24 = pcVar24 + 1;
          } while( true );
        }
        pcStack_6e30 = collect_tests_from_dir;
        assemble_path_cold_1();
        uVar8 = (ulong)extraout_EDX;
        pDStack_70e8 = (DIR *)0x13df0c;
        __filename = __name;
        sStack_6e50 = sVar16;
        pdStack_6e48 = pdVar15;
        pDStack_6e40 = __s;
        pcStack_6e38 = pcVar24;
        pcStack_6e30 = (code *)apcStack_788;
        __dirp = opendir((char *)__name);
        pDStack_70f0 = __s;
        if (__dirp == (DIR *)0x0) goto LAB_0013e018;
        pDStack_70e8 = (DIR *)0x13df20;
        __filename = __dirp;
        pdVar15 = readdir(__dirp);
        do {
          if (pdVar15 == (dirent *)0x0) {
LAB_0013dff7:
            pDStack_70e8 = (DIR *)0x13dfff;
            closedir(__dirp);
            return;
          }
          paths_index = (int)uVar8;
          if (iVar2 <= paths_index) {
            pDStack_70e8 = (DIR *)0x13e018;
            collect_tests_from_dir_cold_1();
            pDStack_70f0 = __dirp;
LAB_0013e018:
            pDStack_70e8 = (DIR *)get_bson_from_json_file;
            collect_tests_from_dir_cold_2();
            uStack_7108 = uVar8;
            pDStack_7100 = paths;
            pdStack_70f8 = pdVar15;
            pDStack_70e8 = __name;
            __stream = fopen((char *)__filename,"rb");
            if (__stream != (FILE *)0x0) {
              fseek(__stream,0,2);
              sVar16 = ftell(__stream);
              fseek(__stream,0,0);
              if (0 < (long)sVar16) {
                pvVar10 = (void *)bson_malloc0(sVar16);
                sVar17 = fread(pvVar10,1,sVar16,__stream);
                if (sVar17 != sVar16) {
                  abort();
                }
                fclose(__stream);
                if (pvVar10 != (void *)0x0) {
                  lVar18 = bson_new_from_json(pvVar10,sVar16,auStack_7308);
                  if (lVar18 == 0) {
                    fprintf(_stderr,"Cannot parse %s: %s\n",__filename,auStack_7300);
                    abort();
                  }
                  bson_free(pvVar10);
                }
              }
            }
            return;
          }
          while ((pdVar15->d_name[0] == '.' &&
                 (((pdVar15->d_name[1] == '.' && (pdVar15->d_name[2] == '\0')) ||
                  (pdVar15->d_name[1] == '\0'))))) {
            pDStack_70e8 = (DIR *)0x13df58;
            pdVar15 = readdir(__dirp);
            if (pdVar15 == (dirent *)0x0) goto LAB_0013dff7;
          }
          pcVar24 = pdVar15->d_name;
          pDStack_70e8 = (DIR *)0x13df7c;
          assemble_path((char *)__name,pcVar24,acStack_7050);
          pDStack_70e8 = (DIR *)0x13df87;
          iVar5 = stat(pcVar24,&sStack_70e0);
          if ((iVar5 == 0) && ((sStack_70e0.st_mode & 0xf000) == 0x4000)) {
            pDStack_70e8 = (DIR *)0x13dfb1;
            uVar3 = collect_tests_from_dir((char (*) [500])paths,acStack_7050,paths_index,iVar2);
            uVar8 = (ulong)uVar3;
          }
          else {
            pDStack_70e8 = (DIR *)0x13dfc4;
            pcVar23 = strstr(pcVar24,".json");
            if (pcVar23 != (char *)0x0) {
              uVar8 = (ulong)(paths_index + 1);
              pDStack_70e8 = (DIR *)0x13dfe3;
              assemble_path((char *)__name,pcVar24,(char *)(paths + (long)paths_index * 500));
            }
          }
          pDStack_70e8 = (DIR *)0x13dfeb;
          __filename = __dirp;
          pdVar15 = readdir(__dirp);
        } while( true );
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

static void
test_int32 (void)
{
   int32_t i32;

   bson_t *bcon = BCON_NEW ("foo", BCON_INT32 (10));

   BSON_ASSERT (BCON_EXTRACT (bcon, "foo", BCONE_INT32 (i32)));

   BSON_ASSERT (i32 == 10);

   bson_destroy (bcon);
}